

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

PolymorphicEmitInfo __thiscall
Wasm::WasmBytecodeGenerator::PopStackPolymorphic
          (WasmBytecodeGenerator *this,PolymorphicEmitInfo expectedTypes,char16 *mismatchMessage)

{
  bool bVar1;
  EmitInfo *pEVar2;
  EmitInfo EVar3;
  PolymorphicEmitInfo PVar4;
  WasmType WStack_58;
  WasmType local_4c;
  EmitInfo local_48;
  uint local_40;
  uint32 local_3c;
  uint32 i;
  uint32 count;
  char16 *mismatchMessage_local;
  WasmBytecodeGenerator *this_local;
  PolymorphicEmitInfo expectedTypes_local;
  PolymorphicEmitInfo info;
  
  expectedTypes_local._0_8_ = expectedTypes.field_1;
  this_local._0_4_ = expectedTypes.count;
  _i = mismatchMessage;
  mismatchMessage_local = (char16 *)this;
  PolymorphicEmitInfo::PolymorphicEmitInfo
            ((PolymorphicEmitInfo *)&expectedTypes_local.field_1.singleInfo);
  local_3c = PolymorphicEmitInfo::Count((PolymorphicEmitInfo *)&this_local);
  PolymorphicEmitInfo::Init
            ((PolymorphicEmitInfo *)&expectedTypes_local.field_1.singleInfo,local_3c,&this->m_alloc)
  ;
  for (local_40 = 0; local_40 < local_3c; local_40 = local_40 + 1) {
    bVar1 = IsUnreachable(this);
    if ((bVar1) &&
       (pEVar2 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Peek
                           (&this->m_evalStack,0), pEVar2->type == Limit)) {
      local_4c = Any;
      EmitInfo::EmitInfo(&local_48,&local_4c);
      PolymorphicEmitInfo::SetInfo
                ((PolymorphicEmitInfo *)&expectedTypes_local.field_1.singleInfo,local_48,local_40);
    }
    else {
      EVar3 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)&this_local,local_40);
      WStack_58 = EVar3.type;
      EVar3 = PopEvalStack(this,WStack_58,_i);
      PolymorphicEmitInfo::SetInfo
                ((PolymorphicEmitInfo *)&expectedTypes_local.field_1.singleInfo,EVar3,local_40);
    }
  }
  PVar4._4_4_ = 0;
  PVar4.count = (uint32)expectedTypes_local.field_1.singleInfo.super_EmitInfoBase.location;
  PVar4.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)info._0_8_;
  return PVar4;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::PopStackPolymorphic(PolymorphicEmitInfo expectedTypes, const char16* mismatchMessage /*= nullptr*/)
{
    PolymorphicEmitInfo info;
    uint32 count = expectedTypes.Count();
    info.Init(count, &m_alloc);

    for (uint32 i = 0; i < count; ++i)
    {
        // Check the stack before popping, it is valid to yield nothing if we are Unreachable
        if (IsUnreachable() && m_evalStack.Peek().type == WasmTypes::Limit)
        {
            info.SetInfo(EmitInfo(WasmTypes::Any), i);
        }
        else
        {
            info.SetInfo(PopEvalStack(expectedTypes.GetInfo(i).type, mismatchMessage), i);
        }
    }
    return info;
}